

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-reverse-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase74::run(TestCase74 *this)

{
  bool bVar1;
  int local_138;
  bool local_131;
  int local_130;
  DebugExpression<int> DStack_12c;
  bool _kj_shouldLog_4;
  undefined1 local_128 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_4;
  int local_f8;
  DebugExpression<int> DStack_f4;
  bool _kj_shouldLog_3;
  undefined1 local_f0 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_3;
  int local_c0;
  DebugExpression<int> DStack_bc;
  bool _kj_shouldLog_2;
  undefined1 local_b8 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_2;
  int local_88;
  DebugExpression<int> DStack_84;
  bool _kj_shouldLog_1;
  undefined1 local_80 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_1;
  bool local_4d;
  uint local_4c;
  uint uStack_48;
  bool _kj_shouldLog;
  DebugExpression<unsigned_int> local_44;
  undefined1 local_40 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  WireValue<uint32_t> *vals;
  TestCase74 *pTStack_10;
  byte bytes [4];
  TestCase74 *this_local;
  
  vals._4_4_ = 0x78563412;
  _kjCondition._24_8_ = (long)&vals + 4;
  uStack_48 = 0x12345678;
  pTStack_10 = this;
  local_44 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffffb8);
  local_4c = SwappingWireValue<unsigned_int,_4UL>::get
                       ((SwappingWireValue<unsigned_int,_4UL> *)_kjCondition._24_8_);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_40,&local_44,&local_4c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    local_4d = kj::_::Debug::shouldLog(ERROR);
    while (local_4d != false) {
      _kjCondition_1._36_4_ = 0x12345678;
      _kjCondition_1._32_4_ =
           SwappingWireValue<unsigned_int,_4UL>::get
                     ((SwappingWireValue<unsigned_int,_4UL> *)_kjCondition._24_8_);
      kj::_::Debug::
      log<char_const(&)[50],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x4f,ERROR,
                 "\"failed: expected \" \"(0x12345678u) == (vals[0].get())\", _kjCondition, 0x12345678u, vals[0].get()"
                 ,(char (*) [50])"failed: expected (0x12345678u) == (vals[0].get())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_40,
                 (uint *)&_kjCondition_1.field_0x24,(uint *)&_kjCondition_1.result);
      local_4d = false;
    }
  }
  SwappingWireValue<unsigned_int,_4UL>::set
            ((SwappingWireValue<unsigned_int,_4UL> *)_kjCondition._24_8_,0x23456789);
  local_88 = 0x23;
  DStack_84 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_88);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_80,&stack0xffffffffffffff7c,
             (uchar *)((long)&vals + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
  if (!bVar1) {
    _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._39_1_ != '\0') {
      _kjCondition_2.result = true;
      _kjCondition_2._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x53,ERROR,
                 "\"failed: expected \" \"(0x23) == (bytes[0])\", _kjCondition, 0x23, bytes[0]",
                 (char (*) [38])"failed: expected (0x23) == (bytes[0])",
                 (DebugComparison<int,_unsigned_char_&> *)local_80,(int *)&_kjCondition_2.result,
                 (uchar *)((long)&vals + 4));
      _kjCondition_2._39_1_ = 0;
    }
  }
  local_c0 = 0x45;
  DStack_bc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_b8,&stack0xffffffffffffff44,
             (uchar *)((long)&vals + 5));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
  if (!bVar1) {
    _kjCondition_3._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._39_1_ != '\0') {
      _kjCondition_3.result = true;
      _kjCondition_3._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x54,ERROR,
                 "\"failed: expected \" \"(0x45) == (bytes[1])\", _kjCondition, 0x45, bytes[1]",
                 (char (*) [38])"failed: expected (0x45) == (bytes[1])",
                 (DebugComparison<int,_unsigned_char_&> *)local_b8,(int *)&_kjCondition_3.result,
                 (uchar *)((long)&vals + 5));
      _kjCondition_3._39_1_ = 0;
    }
  }
  local_f8 = 0x67;
  DStack_f4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_f0,&stack0xffffffffffffff0c,
             (uchar *)((long)&vals + 6));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f0);
  if (!bVar1) {
    _kjCondition_4._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._39_1_ != '\0') {
      _kjCondition_4.result = true;
      _kjCondition_4._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x55,ERROR,
                 "\"failed: expected \" \"(0x67) == (bytes[2])\", _kjCondition, 0x67, bytes[2]",
                 (char (*) [38])"failed: expected (0x67) == (bytes[2])",
                 (DebugComparison<int,_unsigned_char_&> *)local_f0,(int *)&_kjCondition_4.result,
                 (uchar *)((long)&vals + 6));
      _kjCondition_4._39_1_ = 0;
    }
  }
  local_130 = 0x89;
  DStack_12c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_130);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_128,&stack0xfffffffffffffed4,
             (uchar *)((long)&vals + 7));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_128);
  if (!bVar1) {
    local_131 = kj::_::Debug::shouldLog(ERROR);
    while (local_131 != false) {
      local_138 = 0x89;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x56,ERROR,
                 "\"failed: expected \" \"(0x89) == (bytes[3])\", _kjCondition, 0x89, bytes[3]",
                 (char (*) [38])"failed: expected (0x89) == (bytes[3])",
                 (DebugComparison<int,_unsigned_char_&> *)local_128,&local_138,
                 (uchar *)((long)&vals + 7));
      local_131 = false;
    }
  }
  return;
}

Assistant:

TEST(EndianReverse, FourBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78};

  WireValue<uint32_t>* vals = reinterpret_cast<WireValue<uint32_t>*>(bytes);

  EXPECT_EQ(0x12345678u, vals[0].get());

  vals[0].set(0x23456789);

  EXPECT_EQ(0x23, bytes[0]);
  EXPECT_EQ(0x45, bytes[1]);
  EXPECT_EQ(0x67, bytes[2]);
  EXPECT_EQ(0x89, bytes[3]);
}